

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_environment_waitPendingAnalysis(sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t queue;
  sysbvm_tuple_t analysisQueue;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  queue = sysbvm_environment_lookupAnalysisQueue(context,environment);
  if (queue == 0) {
    sysbvm_error("A delayed analysis queue is not available in this context.");
  }
  sysbvm_analysisQueue_waitPendingAnalysis(context,queue);
  return;
}

Assistant:

SYSBVM_API void sysbvm_environment_waitPendingAnalysis(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    sysbvm_tuple_t analysisQueue = sysbvm_environment_lookupAnalysisQueue(context, environment);
    if(!analysisQueue)
        sysbvm_error("A delayed analysis queue is not available in this context.");

    sysbvm_analysisQueue_waitPendingAnalysis(context, analysisQueue);
}